

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::processBinaryWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  char local_2a;
  byte local_29;
  
  uVar2 = (uint)word->_M_string_length;
  if ((int)uVar2 < 1) {
    if (uVar2 != 0) {
LAB_00122a09:
      local_29 = 0;
LAB_00122a0b:
      std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_29,1);
      return 1;
    }
  }
  else {
    uVar10 = 0xffffffff;
    uVar11 = 0;
    do {
      bVar9 = (word->_M_dataplus)._M_p[uVar11];
      if (1 < bVar9 - 0x30) {
        if (bVar9 != 0x2c) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid character in binary number (character is ",0x31)
          ;
          local_2a = (word->_M_dataplus)._M_p[uVar11];
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,&local_2a,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
          cVar6 = (char)poVar3;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar6);
          goto LAB_00122dde;
        }
        if (uVar10 != 0xffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          pcVar5 = "extra comma in binary number";
          lVar4 = 0x1c;
          goto LAB_00122dbc;
        }
        uVar10 = (uint)uVar11;
      }
      uVar11 = uVar11 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar11);
    if (uVar10 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe)
      ;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pcVar5 = "cannot start binary number with a comma";
      lVar4 = 0x27;
      goto LAB_00122dbc;
    }
    if (uVar10 != uVar2 - 1) {
      if (uVar10 == 0xffffffff) {
        if ((int)uVar2 < 9) {
          if (0 < (int)uVar2) {
            uVar11 = 0;
            local_29 = 0;
            do {
              local_29 = local_29 * '\x02' | (word->_M_dataplus)._M_p[uVar11] - 0x30U;
              uVar11 = uVar11 + 1;
            } while ((uVar2 & 0x7fffffff) != uVar11);
            goto LAB_00122a0b;
          }
          goto LAB_00122a09;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error on line ",0xe);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        pcVar5 = "too many digits in binary number";
      }
      else {
        if ((int)uVar10 < 5) {
          iVar8 = ~uVar10 + uVar2;
          if (4 < iVar8) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error on line ",0xe);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            pcVar5 = "too many digits to right of comma";
            lVar4 = 0x21;
            goto LAB_00122dbc;
          }
          if ((int)uVar10 < 1) {
            uVar7 = 0;
          }
          else {
            uVar11 = 0;
            bVar9 = 0;
            do {
              bVar9 = (word->_M_dataplus)._M_p[uVar11] - 0x30U | bVar9 * '\x02';
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
            uVar7 = (uint)bVar9;
          }
          uVar7 = uVar7 << (4U - (char)iVar8 & 0x1f);
          local_29 = (byte)uVar7;
          if (0 < iVar8) {
            lVar4 = (long)(int)uVar10;
            do {
              lVar1 = lVar4 + 1;
              lVar4 = lVar4 + 1;
              uVar7 = uVar7 * 2 & 0xff | (byte)(word->_M_dataplus)._M_p[lVar1] - 0x30;
              local_29 = (byte)uVar7;
            } while (lVar4 < (int)(uVar2 - 1));
          }
          goto LAB_00122a0b;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error on line ",0xe);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        pcVar5 = "too many digits to left of comma";
      }
      lVar4 = 0x20;
      goto LAB_00122dbc;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pcVar5 = "cannot end binary number with a comma";
  lVar4 = 0x25;
LAB_00122dbc:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  cVar6 = '8';
LAB_00122dde:
  std::ostream::put(cVar6);
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processBinaryWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int commaIndex = -1;             // index location of comma in number
	int leftDigits = -1;             // number of digits to left of comma
	int rightDigits = -1;            // number of digits to right of comma
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		if (word [i] == ',') {
			if (commaIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "extra comma in binary number" << std::endl;
				return 0;
			} else {
				commaIndex = i;
			}
		} else if (!(word[i] == '1' || word[i] == '0')) {
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "Invalid character in binary number"
					  " (character is " << word[i] <<")" << std::endl;
			return 0;
		}
	}

	// comma cannot start or end number
	if (commaIndex == 0) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot start binary number with a comma" << std::endl;
		return 0;
	} else if (commaIndex == length - 1 ) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot end binary number with a comma" << std::endl;
		return 0;
	}

	// figure out how many digits there are in binary number
	// number must be able to fit into one byte.
	if (commaIndex != -1) {
		leftDigits = commaIndex;
		rightDigits = length - commaIndex - 1;
	} else if (length > 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits in binary number" << std::endl;
		return 0;
	}
	// if there is a comma, then there cannot be more than 4 digits on a side
	if (leftDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to left of comma" << std::endl;
		return 0;
	}
	if (rightDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to right of comma" << std::endl;
		return 0;
	}

	// OK, we have a valid binary number, so calculate the byte

	uchar output = 0;

	// if no comma in binary number
	if (commaIndex == -1) {
		for (i=0; i<length; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}
	// if comma in binary number
	else {
		for (i=0; i<leftDigits; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
		output = output << (4-rightDigits);
		for (i=0+commaIndex+1; i<rightDigits+commaIndex+1; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}

	// send the byte to the output
	out << output;
	return 1;
}